

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

void __thiscall
CMU462::HalfedgeMesh::build
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions)

{
  size_t *psVar1;
  undefined8 *puVar2;
  _Rb_tree_header *p_Var3;
  pointer puVar4;
  _List_node_base *p_Var5;
  pointer pVVar6;
  _Base_ptr p_Var7;
  list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_> *plVar8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *pvVar9;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar10;
  _Self __tmp;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  _Node *p_Var13;
  iterator iVar14;
  _Base_ptr p_Var15;
  mapped_type *pmVar16;
  _Base_ptr p_Var17;
  FaceIter FVar18;
  _List_node_base *p_Var19;
  _List_node_base *p_Var20;
  ostream *poVar21;
  _Rb_tree_header *p_Var22;
  ulong uVar23;
  HalfedgeMesh *pHVar24;
  HalfedgeMesh *pHVar25;
  long lVar26;
  mapped_type mVar27;
  HalfedgeMesh *pHVar28;
  pointer pvVar29;
  bool bVar30;
  HalfedgeIter hab;
  unsigned_long i;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> polygonIndices;
  Index a;
  VertexIter v;
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  indexToVertex;
  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  vertexDegree;
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  pairToHalfedge;
  _List_iterator<CMU462::Halfedge> local_208;
  HalfedgeMesh *local_200;
  key_type local_1f8;
  key_type local_1e8;
  iterator iStack_1e0;
  _List_iterator<CMU462::Halfedge> *local_1d8;
  iterator *local_1d0;
  iterator *local_1c8;
  ulong local_1c0;
  _List_node_base *local_1b8;
  HalfedgeMesh *local_1b0;
  _List_node_base *local_1a8;
  _List_node_base *local_1a0;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *local_198;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_190;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *local_188;
  key_type local_180;
  pointer local_170;
  pointer local_168;
  long local_160;
  pointer local_158;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  local_150;
  _Rb_tree<std::_List_iterator<CMU462::Vertex>,_std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  local_120;
  undefined1 local_f0 [16];
  _Base_ptr local_e0;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  double local_c8;
  
  local_198 = vertexPositions;
  std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::clear(&this->halfedges);
  local_1b8 = (_List_node_base *)&this->vertices;
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::clear
            ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)local_1b8);
  local_188 = &this->edges;
  std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::clear(local_188);
  local_1a8 = (_List_node_base *)&this->faces;
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)local_1a8);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear(&this->boundaries);
  local_150._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_150._M_impl.super__Rb_tree_header._M_header;
  local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  pHVar25 = (HalfedgeMesh *)
            (polygons->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1b0 = (HalfedgeMesh *)
              (polygons->
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_190 = polygons;
  local_150._M_impl.super__Rb_tree_header._M_header._M_right =
       local_150._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pHVar25 != local_1b0) {
    do {
      if ((ulong)((long)(pHVar25->halfedges).
                        super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
                        _M_impl._M_node.super__List_node_base._M_prev -
                 (long)(pHVar25->halfedges).
                       super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl
                       ._M_node.super__List_node_base._M_next) < 0x11) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: each polygon must have at least three vertices."
                   ,0x5b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0010bbc2;
      }
      iStack_1e0._M_current =
           (_List_iterator<CMU462::Halfedge> *)((ulong)iStack_1e0._M_current & 0xffffffff00000000);
      local_1d8 = (_List_iterator<CMU462::Halfedge> *)0x0;
      local_1d0 = &iStack_1e0;
      local_1c0 = 0;
      p_Var20 = (pHVar25->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node.super__List_node_base._M_prev;
      local_200 = pHVar25;
      local_1c8 = local_1d0;
      for (p_Var19 = (pHVar25->halfedges).
                     super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                     _M_node.super__List_node_base._M_next; pHVar25 = local_200, p_Var19 != p_Var20;
          p_Var19 = (_List_node_base *)&p_Var19->_M_prev) {
        local_1f8.first = (unsigned_long)p_Var19->_M_next;
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&local_1e8,&local_1f8.first);
        p_Var15 = &local_150._M_impl.super__Rb_tree_header._M_header;
        for (p_Var17 = local_150._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var17 != (_Rb_tree_header *)0x0;
            p_Var17 = (&p_Var17->_M_left)[*(_List_node_base **)(p_Var17 + 1) < local_1f8.first]) {
          if (*(_List_node_base **)(p_Var17 + 1) >= local_1f8.first) {
            p_Var15 = p_Var17;
          }
        }
        p_Var3 = &local_150._M_impl.super__Rb_tree_header;
        p_Var22 = p_Var3;
        if (((_Rb_tree_header *)p_Var15 != p_Var3) &&
           (p_Var22 = (_Rb_tree_header *)p_Var15,
           local_1f8.first < (_List_node_base *)((_Rb_tree_header *)p_Var15)->_M_node_count)) {
          p_Var22 = p_Var3;
        }
        if (p_Var22 == p_Var3) {
          memset((Vertex *)local_f0,0,0xc0);
          p_Var13 = std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::
                    _M_create_node<CMU462::Vertex>
                              ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)local_1b8,
                               (Vertex *)local_f0);
          std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
          psVar1 = &(this->vertices).
                    super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          *(HalfedgeMesh **)((p_Var13->_M_storage)._M_storage + 0xb8) = this;
          local_180.first = (unsigned_long)p_Var13;
          pmVar11 = std::
                    map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                  *)&local_150,&local_1f8.first);
          pmVar11->_M_node = (_List_node_base *)local_180.first;
          pmVar12 = std::
                    map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                    ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                  *)&local_120,(key_type *)&local_180);
          *pmVar12 = 1;
        }
        else {
          pmVar11 = std::
                    map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                  *)&local_150,&local_1f8.first);
          pmVar12 = std::
                    map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                    ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                  *)&local_120,pmVar11);
          *pmVar12 = *pmVar12 + 1;
        }
      }
      if (local_1c0 <
          (ulong)((long)(local_200->halfedges).
                        super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
                        _M_impl._M_node.super__List_node_base._M_prev -
                  (long)(local_200->halfedges).
                        super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
                        _M_impl._M_node.super__List_node_base._M_next >> 3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: one of the input polygons does not have distinct vertices!"
                   ,0x66);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"(vertex indices:",0x10);
        p_Var20 = (local_200->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node.super__List_node_base._M_prev;
        for (p_Var19 = (local_200->halfedges).
                       super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl
                       ._M_node.super__List_node_base._M_next; p_Var19 != p_Var20;
            p_Var19 = (_List_node_base *)&p_Var19->_M_prev) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,")",1);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0010bbc2;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&local_1e8);
      pHVar25 = (HalfedgeMesh *)&pHVar25->vertices;
    } while (pHVar25 != local_1b0);
  }
  pvVar10 = local_190;
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::resize
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)local_1a8,
             ((long)(local_190->
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_190->
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_d8 = (_Base_ptr)(local_f0 + 8);
  local_f0._8_4_ = _S_red;
  local_e0 = (_Base_ptr)0x0;
  local_c8 = 0.0;
  pvVar29 = (pvVar10->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_200 = this;
  local_d0 = local_d8;
  if (pvVar29 !=
      (pvVar10->
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_1a8 = local_1a8->_M_next;
      local_1e8._M_node = (_List_node_base *)0x0;
      iStack_1e0._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
      local_1d8 = (_List_iterator<CMU462::Halfedge> *)0x0;
      local_168 = (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      local_170 = (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      pHVar25 = (HalfedgeMesh *)((long)local_170 - (long)local_168 >> 3);
      if (local_170 != local_168) {
        local_160 = -(ulong)(pHVar25 == (HalfedgeMesh *)0x0) - (long)pHVar25;
        pHVar28 = (HalfedgeMesh *)0x1;
        local_1b0 = pHVar25;
        local_158 = pvVar29;
        do {
          puVar4 = (local_158->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          local_1f8.first =
               puVar4[(long)((long)&pHVar28[-1].boundaries.
                                    super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
                                    _M_impl + 0x17)];
          pHVar24 = (HalfedgeMesh *)0x0;
          if (pHVar25 != pHVar28) {
            pHVar24 = pHVar28;
          }
          p_Var13 = (_Node *)puVar4[(long)pHVar24];
          local_208._M_node = (_List_node_base *)0x0;
          local_1f8.second = (unsigned_long)p_Var13;
          local_1a0 = (_List_node_base *)local_1f8.first;
          iVar14 = std::
                   _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                   ::find((_Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                           *)local_f0,&local_1f8);
          if (iVar14._M_node != (_Base_ptr)(local_f0 + 8)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Error converting polygons to halfedge mesh: found multiple oriented edges with indices ("
                       ,0x58);
            poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
            poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,").",2);
            std::endl<char,std::char_traits<char>>(poVar21);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "This means that either (i) more than two faces contain this edge (hence the surface is nonmanifold), or"
                       ,0x67);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "(ii) there are exactly two faces containing this edge, but they have the same orientation (hence the surface is"
                       ,0x6f);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"not consistently oriented.",0x1a);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            goto LAB_0010bbc2;
          }
          p_Var15 = (_Base_ptr)operator_new(0x38);
          pHVar25 = local_200;
          *(_List_node_base **)&p_Var15[1]._M_color = (_List_node_base *)0x0;
          p_Var15[1]._M_parent = (_Base_ptr)0x0;
          p_Var15->_M_left = (_Base_ptr)0x0;
          p_Var15->_M_right = (_Base_ptr)0x0;
          p_Var15[1]._M_left = (_Base_ptr)0x0;
          std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var15);
          psVar1 = &(pHVar25->halfedges).
                    super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_208._M_node = (_List_node_base *)p_Var15;
          pmVar16 = std::
                    map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                    ::operator[]((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                                  *)local_f0,&local_1f8);
          pmVar16->_M_node = local_208._M_node;
          local_208._M_node[3]._M_next = local_1a8;
          local_1a8[9]._M_next = local_208._M_node;
          pmVar11 = std::
                    map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                  *)&local_150,(key_type *)&local_1a0);
          p_Var19 = pmVar11->_M_node;
          *(_List_node_base **)(local_208._M_node + 2) = p_Var19;
          p_Var19[0xc]._M_prev = local_208._M_node;
          if (iStack_1e0._M_current == local_1d8) {
            std::
            vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
            ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                      ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                        *)&local_1e8,iStack_1e0,&local_208);
          }
          else {
            (iStack_1e0._M_current)->_M_node = local_208._M_node;
            iStack_1e0._M_current = iStack_1e0._M_current + 1;
          }
          local_180.second = (unsigned_long)local_1a0;
          local_180.first = (unsigned_long)p_Var13;
          iVar14 = std::
                   _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                   ::find((_Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                           *)local_f0,&local_180);
          if (iVar14._M_node == (_Base_ptr)(local_f0 + 8)) {
            local_208._M_node[1]._M_next = (_List_node_base *)local_200;
            pHVar25 = local_1b0;
          }
          else {
            p_Var15 = iVar14._M_node[1]._M_left;
            local_208._M_node[1]._M_next = (_List_node_base *)p_Var15;
            p_Var15->_M_left = (_Base_ptr)local_208._M_node;
            p_Var17 = (_Base_ptr)operator_new(0x60);
            pHVar25 = local_1b0;
            *(undefined8 *)((long)&p_Var17->_M_right + 1) = 0;
            *(undefined8 *)((long)&p_Var17[1]._M_color + 1) = 0;
            p_Var17->_M_left = (_Base_ptr)0x0;
            p_Var17->_M_right = (_Base_ptr)0x0;
            p_Var17[1]._M_left = (_Base_ptr)0x0;
            p_Var17[1]._M_right = (_Base_ptr)0x0;
            *(undefined8 *)(p_Var17 + 2) = 0;
            p_Var17[2]._M_parent = (_Base_ptr)0x0;
            p_Var17[2]._M_left = (_Base_ptr)0x0;
            p_Var17[2]._M_right = (_Base_ptr)0x0;
            std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var17);
            psVar1 = &(local_200->edges).
                      super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
                      _M_size;
            *psVar1 = *psVar1 + 1;
            ((_Base_ptr)(local_208._M_node + 2))->_M_parent = p_Var17;
            p_Var15[1]._M_parent = p_Var17;
            p_Var17[2]._M_right = (_Base_ptr)local_208._M_node;
          }
          plVar8 = &pHVar28->halfedges;
          pHVar28 = (HalfedgeMesh *)
                    ((long)&(pHVar28->halfedges).
                            super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
                            _M_impl._M_node.super__List_node_base._M_next + 1);
          pvVar29 = local_158;
        } while ((long)&(plVar8->
                        super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>).
                        _M_impl._M_node.super__List_node_base._M_next + local_160 != 0);
      }
      pvVar10 = local_190;
      this = local_200;
      if (local_170 != local_168) {
        pHVar28 = (HalfedgeMesh *)0x1;
        do {
          pHVar24 = (HalfedgeMesh *)0x0;
          if (pHVar25 != pHVar28) {
            pHVar24 = pHVar28;
          }
          *(_List_node_base **)(*(long *)((long)local_1e8._M_node + (long)pHVar28 * 8 + -8) + 0x18)
               = (&(local_1e8._M_node)->_M_next)[(long)pHVar24];
          lVar26 = (-(ulong)(pHVar25 == (HalfedgeMesh *)0x0) - (long)pHVar25) + (long)pHVar28;
          pHVar28 = (HalfedgeMesh *)
                    ((long)&(pHVar28->halfedges).
                            super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
                            _M_impl._M_node.super__List_node_base._M_next + 1);
        } while (lVar26 != 0);
      }
      if (local_1e8._M_node != (_List_node_base *)0x0) {
        operator_delete(local_1e8._M_node,(long)local_1d8 - (long)local_1e8._M_node);
      }
      pvVar29 = pvVar29 + 1;
    } while (pvVar29 !=
             (pvVar10->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  for (p_Var19 = local_1b8->_M_next; p_Var19 != local_1b8; p_Var19 = p_Var19->_M_next) {
    p_Var20 = p_Var19[0xc]._M_prev;
    do {
      if ((HalfedgeMesh *)p_Var20[1]._M_next == this) {
        p_Var19[0xc]._M_prev = p_Var20;
        break;
      }
      p_Var20 = (((HalfedgeMesh *)p_Var20[1]._M_next)->vertices).
                super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                super__List_node_base._M_next;
    } while (p_Var19[0xc]._M_prev != p_Var20);
  }
  pHVar25 = (HalfedgeMesh *)
            (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  p_Var19 = local_1b8;
  if (pHVar25 != this) {
    do {
      if ((HalfedgeMesh *)
          (pHVar25->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>
          ._M_impl._M_node._M_size == this) {
        FVar18 = newBoundary(this);
        local_1e8._M_node = (_List_node_base *)0x0;
        iStack_1e0._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
        local_1d8 = (_List_iterator<CMU462::Halfedge> *)0x0;
        pHVar28 = pHVar25;
        do {
          p_Var19 = (_List_node_base *)operator_new(0x38);
          p_Var19[2]._M_next = (_List_node_base *)0x0;
          p_Var19[2]._M_prev = (_List_node_base *)0x0;
          p_Var19[1]._M_next = (_List_node_base *)0x0;
          p_Var19[1]._M_prev = (_List_node_base *)0x0;
          p_Var19[3]._M_next = (_List_node_base *)0x0;
          std::__detail::_List_node_base::_M_hook(p_Var19);
          psVar1 = &(this->halfedges).
                    super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_1f8.first = (unsigned_long)p_Var19;
          if (iStack_1e0._M_current == local_1d8) {
            std::
            vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
            ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                      ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                        *)&local_1e8,iStack_1e0,(_List_iterator<CMU462::Halfedge> *)&local_1f8);
          }
          else {
            (iStack_1e0._M_current)->_M_node = p_Var19;
            iStack_1e0._M_current = iStack_1e0._M_current + 1;
          }
          (pHVar28->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>
          ._M_impl._M_node._M_size = local_1f8.first;
          ((_List_node_base *)(local_1f8.first + 0x10))->_M_next = (_List_node_base *)pHVar28;
          ((_List_node_base *)(local_1f8.first + 0x30))->_M_next = FVar18._M_node;
          ((_List_node_base *)(local_1f8.first + 0x20))->_M_next =
               (pHVar28->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>
               ._M_impl._M_node.super__List_node_base._M_next[2]._M_next;
          p_Var20 = (_List_node_base *)operator_new(0x60);
          *(undefined8 *)((long)&p_Var20[1]._M_prev + 1) = 0;
          *(undefined8 *)((long)&p_Var20[2]._M_next + 1) = 0;
          p_Var20[1]._M_next = (_List_node_base *)0x0;
          p_Var20[1]._M_prev = (_List_node_base *)0x0;
          p_Var20[3]._M_next = (_List_node_base *)0x0;
          p_Var20[3]._M_prev = (_List_node_base *)0x0;
          p_Var20[4]._M_next = (_List_node_base *)0x0;
          p_Var20[4]._M_prev = (_List_node_base *)0x0;
          p_Var20[5]._M_next = (_List_node_base *)0x0;
          p_Var20[5]._M_prev = (_List_node_base *)0x0;
          std::__detail::_List_node_base::_M_hook(p_Var20);
          p_Var19 = local_1b8;
          psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                    _M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          p_Var20[5]._M_prev = (_List_node_base *)pHVar28;
          (pHVar28->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
          _M_impl._M_node._M_size = (size_t)p_Var20;
          ((_List_node_base *)(local_1f8.first + 0x20))->_M_prev = p_Var20;
          pHVar28 = (HalfedgeMesh *)
                    (pHVar28->vertices).
                    super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
                    _M_node.super__List_node_base._M_next;
          bVar30 = pHVar25 == pHVar28;
          if (bVar30) break;
          pHVar24 = (HalfedgeMesh *)
                    (pHVar28->halfedges).
                    super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                    _M_node._M_size;
          while (pHVar24 != this) {
            pHVar28 = *(HalfedgeMesh **)
                       ((pHVar28->halfedges).
                        super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
                        _M_impl._M_node._M_size + 0x18);
            bVar30 = pHVar25 == pHVar28;
            if (bVar30) goto LAB_0010b81b;
            pHVar24 = (HalfedgeMesh *)
                      (pHVar28->halfedges).
                      super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                      _M_node._M_size;
          }
        } while (!bVar30);
LAB_0010b81b:
        FVar18._M_node[9]._M_next = (local_1e8._M_node)->_M_next;
        if ((long)iStack_1e0._M_current - (long)local_1e8._M_node != 0) {
          uVar23 = (long)iStack_1e0._M_current - (long)local_1e8._M_node >> 3;
          lVar26 = 0;
          do {
            (&(local_1e8._M_node)->_M_next)[lVar26][1]._M_prev =
                 (&(local_1e8._M_node)->_M_next)[((uVar23 - 1) + lVar26) % uVar23];
            lVar26 = lVar26 + 1;
          } while (uVar23 + (uVar23 == 0) != lVar26);
        }
        operator_delete(local_1e8._M_node,(long)local_1d8 - (long)local_1e8._M_node);
      }
      pHVar25 = (HalfedgeMesh *)
                (pHVar25->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node.super__List_node_base._M_next;
    } while (pHVar25 != this);
  }
  p_Var20 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var19->_M_next)->
            _M_impl)._M_node.super__List_node_base._M_next;
  while (p_Var20 != p_Var19) {
    p_Var5 = p_Var20->_M_next;
    p_Var20[0xc]._M_prev = p_Var20[0xc]._M_prev[1]._M_next[1]._M_prev;
    p_Var20 = p_Var5;
  }
  local_1e8._M_node = p_Var19->_M_next;
  if (local_1e8._M_node != p_Var19) {
    do {
      if ((HalfedgeMesh *)local_1e8._M_node[0xc]._M_prev == this) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: some vertices are not referenced by any polygon."
                   ,0x5c);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0010bbc2;
      }
      mVar27 = 0;
      p_Var20 = local_1e8._M_node[0xc]._M_prev;
      do {
        mVar27 = mVar27 + ((ulong)*(byte *)&p_Var20[3]._M_next[9]._M_prev ^ 1);
        p_Var20 = p_Var20[1]._M_next[1]._M_prev;
      } while (local_1e8._M_node[0xc]._M_prev != p_Var20);
      pmVar12 = std::
                map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                              *)&local_120,&local_1e8);
      if (mVar27 != *pmVar12) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: at least one of the vertices is nonmanifold."
                   ,0x58);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0010bbc2;
      }
      local_1e8._M_node = (local_1e8._M_node)->_M_next;
    } while (local_1e8._M_node != p_Var19);
  }
  pvVar9 = local_198;
  if ((this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node._M_size <=
      (ulong)(((long)(local_198->
                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_198->
                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    p_Var3 = &local_150._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_150._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
      lVar26 = 0;
      p_Var15 = local_150._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var17 = p_Var15[1]._M_parent;
        pVVar6 = (pvVar9->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(p_Var17 + 1) = *(undefined8 *)((long)&pVVar6->z + lVar26);
        puVar2 = (undefined8 *)((long)&pVVar6->x + lVar26);
        p_Var7 = (_Base_ptr)puVar2[1];
        p_Var17->_M_left = (_Base_ptr)*puVar2;
        p_Var17->_M_right = p_Var7;
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        lVar26 = lVar26 + 0x18;
      } while ((_Rb_tree_header *)p_Var15 != p_Var3);
    }
    std::
    _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                 *)local_f0);
    std::
    _Rb_tree<std::_List_iterator<CMU462::Vertex>,_std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_120);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
    ::~_Rb_tree(&local_150);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Error converting polygons to halfedge mesh: number of vertex positions is different from the number of distinct vertices!"
             ,0x79);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(number of positions in input: ",0x1f);
  poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar21,")",1);
  std::endl<char,std::char_traits<char>>(poVar21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(  number of vertices in mesh: ",0x1f);
  poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar21,")",1);
  std::endl<char,std::char_traits<char>>(poVar21);
LAB_0010bbc2:
  exit(1);
}

Assistant:

void HalfedgeMesh::build(const vector<vector<Index> >& polygons,
                         const vector<Vector3D>& vertexPositions)
// This method initializes the halfedge data structure from a raw list of
// polygons, where each input polygon is specified as a list of vertex indices.
// The input must describe a manifold, oriented surface, where the orientation
// of a polygon is determined by the order of vertices in the list. Polygons
// must have at least three vertices.  Note that there are no special conditions
// on the vertex indices, i.e., they do not have to start at 0 or 1, nor does
// the collection of indices have to be contiguous.  Overall, this initializer
// is designed to be robust but perhaps not incredibly fast (though of course
// this does not affect the performance of the resulting data structure).  One
// could also implement faster initializers that handle important special cases
// (e.g., all triangles, or data that is known to be manifold). Since there are
// no strong conditions on the indices of polygons, we assume that the list of
// vertex positions is given in lexicographic order (i.e., that the lowest index
// appearing in any polygon corresponds to the first entry of the list of
// positions and so on).
{
  // define some types, to improve readability
  typedef vector<Index> IndexList;
  typedef IndexList::const_iterator IndexListCIter;
  typedef vector<IndexList> PolygonList;
  typedef PolygonList::const_iterator PolygonListCIter;
  typedef pair<Index, Index> IndexPair;  // ordered pair of vertex indices,
                                         // corresponding to an edge of an
                                         // oriented polygon

  // Clear any existing elements.
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Since the vertices in our halfedge mesh are stored in a linked list,
  // we will temporarily need to keep track of the correspondence between
  // indices of vertices in our input and pointers to vertices in the new
  // mesh (which otherwise can't be accessed by index).  Note that since
  // we're using a general-purpose map (rather than, say, a vector), we can
  // be a bit more flexible about the indexing scheme: input vertex indices
  // aren't required to be 0-based or 1-based; in fact, the set of indices
  // doesn't even have to be contiguous.  Taking advantage of this fact makes
  // our conversion a bit more robust to different types of input, including
  // data that comes from a subset of a full mesh.

  // maps a vertex index to the corresponding vertex
  map<Index, VertexIter> indexToVertex;

  // Also store the vertex degree, i.e., the number of polygons that use each
  // vertex; this information will be used to check that the mesh is manifold.
  map<VertexIter, Size> vertexDegree;

  // First, we do some basic sanity checks on the input.
  for (const auto & polygon : polygons) {
    if (polygon.size() < 3) {
      // Refuse to build the mesh if any of the polygons have fewer than three
      // vertices.(Note that if we omit this check the code will still
      // construct something fairly meaningful for 1- and 2-point polygons, but
      // enforcing this stricter requirement on the input will help simplify code
      // further downstream, since it can be certain it doesn't have to check for
      // these rather degenerate cases.)
      cerr << "Error converting polygons to halfedge mesh: each polygon must "
              "have at least three vertices."
           << endl;
      exit(1);
    }

    // We want to count the number of distinct vertex indices in this
    // polygon, to make sure it's the same as the number of vertices
    // in the polygon---if they disagree, then the polygon is not valid
    // (or at least, for simplicity we don't handle polygons of this type!).
    set<Index> polygonIndices;

    // loop over polygon vertices
    for (unsigned long i : polygon) {
      polygonIndices.insert(i);

      // allocate one vertex for each new index we encounter
      if (indexToVertex.find(i) == indexToVertex.end()) {
        auto v = newVertex();
        v->halfedge() = halfedges.end();  // this vertex doesn't yet point to any halfedge
        indexToVertex[i] = v;
        vertexDegree[v] = 1;  // we've now seen this vertex only once
      } else {
        // keep track of the number of times we've seen this vertex
        vertexDegree[indexToVertex[i]]++;
      }

    }  // end loop over polygon vertices

    // check that all vertices of the current polygon are distinct
    Size degree = polygon.size();  // number of vertices in this polygon
    if (polygonIndices.size() < degree) {
      cerr << "Error converting polygons to halfedge mesh: one of the input "
              "polygons does not have distinct vertices!"
           << endl;
      cerr << "(vertex indices:";
      for (unsigned long i : polygon) {
        cerr << " " << i;
      }
      cerr << ")" << endl;
      exit(1);
    }  // end check that polygon vertices are distinct

  }  // end basic sanity checks on input

  // The number of faces is just the number of polygons in the input.
  Size nFaces = polygons.size();
  faces.resize(nFaces);  // allocate storage for faces in our new mesh

  // We will store a map from ordered pairs of vertex indices to
  // the corresponding halfedge object in our new (halfedge) mesh;
  // this map gets constructed during the next loop over polygons.
  map<IndexPair, HalfedgeIter> pairToHalfedge;

  // Next, we actually build the halfedge connectivity by again looping over
  // polygons
  PolygonListCIter p;
  FaceIter f;
  for (p = polygons.begin(), f = faces.begin(); p != polygons.end(); p++, f++) {
    vector<HalfedgeIter> faceHalfedges;  // cyclically ordered list of the half
                                         // edges of this face
    Size degree = p->size();             // number of vertices in this polygon

    // loop over the halfedges of this face (equivalently, the ordered pairs of
    // consecutive vertices)
    for (Index i = 0; i < degree; i++) {
      Index a = (*p)[i];                 // current index
      Index b = (*p)[(i + 1) % degree];  // next index, in cyclic order
      IndexPair ab(a, b);
      HalfedgeIter hab;

      // check if this halfedge already exists; if so, we have a problem!
      if (pairToHalfedge.find(ab) != pairToHalfedge.end()) {
        cerr << "Error converting polygons to halfedge mesh: found multiple "
                "oriented edges with indices ("
             << a << ", " << b << ")." << endl;
        cerr << "This means that either (i) more than two faces contain this "
                "edge (hence the surface is nonmanifold), or"
             << endl;
        cerr << "(ii) there are exactly two faces containing this edge, but "
                "they have the same orientation (hence the surface is"
             << endl;
        cerr << "not consistently oriented." << endl;
        exit(1);
      } else  // otherwise, the halfedge hasn't been allocated yet
      {
        // so, we point this vertex pair to a new halfedge
        hab = newHalfedge();
        pairToHalfedge[ab] = hab;

        // link the new halfedge to its face
        hab->face() = f;
        hab->face()->halfedge() = hab;

        // also link it to its starting vertex
        hab->vertex() = indexToVertex[a];
        hab->vertex()->halfedge() = hab;

        // keep a list of halfedges in this face, so that we can later
        // link them together in a loop (via their "next" pointers)
        faceHalfedges.push_back(hab);
      }

      // Also, check if the twin of this halfedge has already been constructed
      // (during construction of a different face).  If so, link the twins
      // together and allocate their shared halfedge.  By the end of this pass
      // over polygons, the only halfedges that will not have a twin will hence
      // be those that sit along the domain boundary.
      IndexPair ba(b, a);
      auto iba = pairToHalfedge.find(ba);
      if (iba != pairToHalfedge.end()) {
        auto hba = iba->second;

        // link the twins
        hab->twin() = hba;
        hba->twin() = hab;

        // allocate and link their edge
        auto e = newEdge();
        hab->edge() = e;
        hba->edge() = e;
        e->halfedge() = hab;
      } else {  // If we didn't find a twin...
        // ...mark this halfedge as being twinless by pointing
        // it to the end of the list of halfedges. If it remains
        // twinless by the end of the current loop over polygons,
        // it will be linked to a boundary face in the next pass.
        hab->twin() = halfedges.end();
      }

    }  // end loop over the current polygon's halfedges

    // Now that all the halfedges of this face have been allocated,
    // we can link them together via their "next" pointers.
    for (Index i = 0; i < degree; i++) {
      Index j = (i + 1) % degree;  // index of the next halfedge, in cyclic order
      faceHalfedges[i]->next() = faceHalfedges[j];
    }

  }  // done building basic halfedge connectivity

  // For each vertex on the boundary, advance its halfedge pointer to one that
  // is also on the boundary.
  for (auto v = verticesBegin(); v != verticesEnd(); v++) {
    // loop over halfedges around vertex
    auto h = v->halfedge();
    do {
      if (h->twin() == halfedges.end()) {
        v->halfedge() = h;
        break;
      }

      h = h->twin()->next();
    } while (h != v->halfedge());  // end loop over halfedges around vertex

  }  // done advancing halfedge pointers for boundary vertices

  // Next we construct new faces for each boundary component.
  for (auto h = halfedgesBegin(); h != halfedgesEnd(); h++)  // loop over all halfedges
  {
    // Any halfedge that does not yet have a twin is on the boundary of the
    // domain. If we follow the boundary around long enough we will of course
    // eventually make a closed loop; we can represent this boundary loop by a
    // new face. To make clear the distinction between faces and boundary loops,
    // the boundary face will (i) have a flag indicating that it is a boundary
    // loop, and (ii) be stored in a list of boundaries, rather than the usual
    // list of faces.  The reason we need the both the flag *and* the separate
    // list is that faces are often accessed in two fundamentally different
    // ways: either by (i) local traversal of the neighborhood of some mesh
    // element using the halfedge structure, or (ii) global traversal of all
    // faces (or boundary loops).
    if (h->twin() == halfedges.end()) {
      auto b = newBoundary();
      vector<HalfedgeIter> boundaryHalfedges;  // keep a list of halfedges along
                                               // the boundary, so we can link
                                               // them together

      // We now need to walk around the boundary, creating new
      // halfedges and edges along the boundary loop as we go.
      auto i = h;
      do {
        // create a twin, which becomes a halfedge of the boundary loop
        auto t = newHalfedge();
        boundaryHalfedges.push_back(t);  // keep a list of all boundary halfedges, in cyclic order
        i->twin() = t;
        t->twin() = i;
        t->face() = b;
        t->vertex() = i->next()->vertex();

        // create the shared edge
        auto e = newEdge();
        e->halfedge() = i;
        i->edge() = e;
        t->edge() = e;

        // Advance i to the next halfedge along the current boundary loop
        // by walking around its target vertex and stopping as soon as we
        // find a halfedge that does not yet have a twin defined.
        i = i->next();
        while (i != h &&  // we're done if we end up back at the beginning of
                          // the loop
               i->twin() != halfedges.end())  // otherwise, we're looking for
                                              // the next twinless halfedge
                                              // along the loop
        {
          i = i->twin();
          i = i->next();
        }
      } while (i != h);

      b->halfedge() = boundaryHalfedges.front();

      // The only pointers that still need to be set are the "next" pointers of
      // the twins; these we can set from the list of boundary halfedges, but we
      // must use the opposite order from the order in the list, since the
      // orientation of the boundary loop is opposite the orientation of the
      // halfedges "inside" the domain boundary.
      Size degree = boundaryHalfedges.size();
      for (Index p = 0; p < degree; p++) {
        Index q = (p - 1 + degree) % degree;
        boundaryHalfedges[p]->next() = boundaryHalfedges[q];
      }

    }  // end construction of one of the boundary loops

    // Note that even though we are looping over all halfedges, we will still
    // construct the appropriate number of boundary loops (and not, say, one
    // loop per boundary halfedge).  The reason is that as we continue to
    // iterate through halfedges, we check whether their twin has been assigned,
    // and since new twins may have been assigned earlier in this loop, we will
    // end up skipping many subsequent halfedges.

  }  // done adding "virtual" faces corresponding to boundary loops

  // To make later traversal of the mesh easier, we will now advance the
  // halfedge
  // associated with each vertex such that it refers to the *first* non-boundary
  // halfedge, rather than the last one.
  for (auto v = verticesBegin(); v != verticesEnd(); v++) {
    v->halfedge() = v->halfedge()->twin()->next();
  }

  // Finally, we check that all vertices are manifold.
  for (auto v = vertices.begin(); v != vertices.end(); v++) {
    // First check that this vertex is not a "floating" vertex;
    // if it is then we do not have a valid 2-manifold surface.
    if (v->halfedge() == halfedges.end()) {
      cerr << "Error converting polygons to halfedge mesh: some vertices are "
              "not referenced by any polygon."
           << endl;
      exit(1);
    }

    // Next, check that the number of halfedges emanating from this vertex in
    // our half edge data structure equals the number of polygons containing
    // this vertex, which we counted during our first pass over the mesh.  If
    // not, then our vertex is not a "fan" of polygons, but instead has some
    // other (nonmanifold) structure.
    Size count = 0;
    auto h = v->halfedge();
    do {
      if (!h->face()->isBoundary()) {
        count++;
      }
      h = h->twin()->next();
    } while (h != v->halfedge());

    if (count != vertexDegree[v]) {
      cerr << "Error converting polygons to halfedge mesh: at least one of the "
              "vertices is nonmanifold."
           << endl;
      exit(1);
    }
  }  // end loop over vertices

  // Now that we have the connectivity, we copy the list of vertex
  // positions into member variables of the individual vertices.
  if (vertexPositions.size() < vertices.size()) {
    cerr << "Error converting polygons to halfedge mesh: number of vertex "
            "positions is different from the number of distinct vertices!"
         << endl;
    cerr << "(number of positions in input: " << vertexPositions.size() << ")"
         << endl;
    cerr << "(  number of vertices in mesh: " << vertices.size() << ")" << endl;
    exit(1);
  }
  // Since an STL map internally sorts its keys, we can iterate over the map
  // from vertex indices to vertex iterators to visit our (input) vertices in
  // lexicographic order
  int i = 0;
  for (map<Index, VertexIter>::const_iterator e = indexToVertex.begin();
       e != indexToVertex.end(); e++) {
    // grab a pointer to the vertex associated with the current key (i.e., the
    // current index)
    VertexIter v = e->second;

    // set the att of this vertex to the corresponding
    // position in the input
    v->position = vertexPositions[i];
    i++;
  }

}